

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O3

void __thiscall
t_swift_generator::generate_swift_service_helpers(t_swift_generator *this,t_service *tservice)

{
  t_struct *ptVar1;
  pointer pptVar2;
  t_swift_generator *this_00;
  pointer pptVar3;
  string qname;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  t_struct qname_ts;
  string local_130;
  vector<t_function_*,_std::allocator<t_function_*>_> local_110;
  t_struct local_f8;
  
  this_00 = (t_swift_generator *)&tservice->functions_;
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            (&local_110,(vector<t_function_*,_std::allocator<t_function_*>_> *)this_00);
  if (local_110.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_110.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pptVar2 = local_110.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      ptVar1 = (*pptVar2)->arglist_;
      function_args_helper_struct_type_abi_cxx11_(&local_130,this_00,tservice,*pptVar2);
      t_struct::t_struct(&local_f8,(ptVar1->super_t_type).program_,&local_130);
      for (pptVar3 = (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          pptVar3 !=
          (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar3 = pptVar3 + 1) {
        t_struct::append(&local_f8,*pptVar3);
      }
      generate_swift_struct(this,(ostream *)&this->f_impl_,&local_f8,true);
      generate_swift_struct_implementation(this,(ostream *)&this->f_impl_,&local_f8,false,true);
      this_00 = (t_swift_generator *)tservice;
      generate_function_helpers(this,tservice,*pptVar2);
      local_f8.super_t_type.super_t_doc._vptr_t_doc = (_func_int **)&PTR__t_struct_0040eeb8;
      if (local_f8.members_in_id_order_.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f8.members_in_id_order_.
                        super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_f8.members_.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f8.members_.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      t_type::~t_type(&local_f8.super_t_type);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      pptVar2 = pptVar2 + 1;
    } while (pptVar2 !=
             local_110.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_110.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void t_swift_generator::generate_swift_service_helpers(t_service* tservice) {
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {

    t_struct* ts = (*f_iter)->get_arglist();

    string qname = function_args_helper_struct_type(tservice, *f_iter);

    t_struct qname_ts = t_struct(ts->get_program(), qname);

    const vector<t_field*>& members = ts->get_members();
    vector<t_field*>::const_iterator m_iter;
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      qname_ts.append(*m_iter);
    }

    generate_swift_struct(f_impl_, &qname_ts, true);
    generate_swift_struct_implementation(f_impl_, &qname_ts, false, true);
    generate_function_helpers(tservice, *f_iter);
  }
}